

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::calculateHPageOffset(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *this_00;
  Members *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_01;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Object *pOVar9;
  NewObject *this_02;
  qpdf_offset_t qVar10;
  unsigned_long uVar11;
  reference __x;
  size_type sVar12;
  uint uVar13;
  size_t j;
  ulong uVar14;
  CHPageOffset *this_03;
  allocator_type local_ad;
  int local_ac;
  long local_a8;
  int local_9c;
  int local_98;
  int local_94;
  ObjTable *local_90;
  ObjTable<QPDFWriter::NewObject> *local_88;
  QPDF *local_80;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_78;
  size_type local_70;
  Members *local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  local_90 = obj;
  local_88 = &new_obj->super_ObjTable<QPDFWriter::NewObject>;
  this_01 = getAllPages(this);
  sVar12 = (long)(this_01->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this_01->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  this_03 = &((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->c_page_offset_data;
  pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                     (&this_03->entries,0);
  iVar3 = pvVar5->nobjects;
  local_a8 = CONCAT44(local_a8._4_4_,iVar3);
  local_78 = this_01;
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this_01,0);
  iVar2 = QPDFObjectHandle::getObjectID(pvVar6);
  iVar3 = outputLengthNextN(this,iVar2,iVar3,(NewObjTable *)local_88,local_90);
  pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                     (&this_03->entries,0);
  local_98 = pvVar5->nshared_objects;
  local_68 = (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  this_00 = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
            ((long)&local_68->page_offset_hints + 0x40);
  local_80 = this;
  local_70 = sVar12;
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::vector
            ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)&local_50,
             sVar12,&local_ad);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::_M_move_assign
            (this_00);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector
            ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)&local_50);
  local_ac = (int)local_a8;
  local_9c = iVar3;
  local_94 = iVar3;
  for (uVar13 = 0; pMVar1 = local_68, uVar14 = (ulong)uVar13, uVar14 < local_70; uVar13 = uVar13 + 1
      ) {
    pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                       (&this_03->entries,uVar14);
    iVar3 = pvVar5->nobjects;
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_78,uVar14);
    iVar2 = QPDFObjectHandle::getObjectID(pvVar6);
    iVar2 = outputLengthNextN(local_80,iVar2,iVar3,(NewObjTable *)local_88,local_90);
    pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                       (&this_03->entries,uVar14);
    if (iVar3 < local_ac) {
      local_ac = iVar3;
    }
    iVar4 = (int)local_a8;
    if ((int)local_a8 <= iVar3) {
      iVar4 = iVar3;
    }
    local_a8 = CONCAT44(local_a8._4_4_,iVar4);
    if (iVar2 < local_9c) {
      local_9c = iVar2;
    }
    if (local_94 <= iVar2) {
      local_94 = iVar2;
    }
    iVar4 = pvVar5->nshared_objects;
    if (local_98 <= iVar4) {
      local_98 = iVar4;
    }
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,uVar14);
    pvVar7->delta_nobjects = iVar3;
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,uVar14);
    pvVar7->delta_page_length = (long)iVar2;
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,uVar14);
    pvVar7->nshared_objects = iVar4;
  }
  (local_68->page_offset_hints).min_nobjects = local_ac;
  p_Var8 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_78,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_60,p_Var8);
  pOVar9 = ObjTable<QPDFWriter::Object>::operator[]
                     (&local_90->super_ObjTable<QPDFWriter::Object>,(QPDFObjectHandle *)&local_60);
  this_02 = ObjTable<QPDFWriter::NewObject>::operator[](local_88,pOVar9->renumber);
  qVar10 = QPDFXRefEntry::getOffset(&this_02->xref);
  (pMVar1->page_offset_hints).first_page_offset = qVar10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  iVar2 = nbits((int)local_a8 - local_ac);
  iVar3 = local_9c;
  (pMVar1->page_offset_hints).nbits_delta_nobjects = iVar2;
  (pMVar1->page_offset_hints).min_page_length = local_9c;
  iVar2 = nbits(local_94 - local_9c);
  (pMVar1->page_offset_hints).nbits_delta_page_length = iVar2;
  iVar4 = nbits(local_98);
  (pMVar1->page_offset_hints).nbits_nshared_objects = iVar4;
  iVar4 = nbits(*(int *)((long)&((local_80->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                c_shared_object_data + 8));
  (pMVar1->page_offset_hints).nbits_shared_identifier = iVar4;
  (pMVar1->page_offset_hints).shared_denominator = 4;
  (pMVar1->page_offset_hints).nbits_delta_content_length = iVar2;
  (pMVar1->page_offset_hints).min_content_length = iVar3;
  local_a8 = (long)iVar3;
  sVar12 = 0;
  do {
    if (sVar12 == local_70) {
      return;
    }
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,sVar12);
    if (pvVar7->delta_nobjects < local_ac) {
LAB_001d7ee6:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "found too small delta nobjects or delta page length while writing linearization data"
                 ,(allocator<char> *)&local_ad);
      stopOnError(local_80,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (this_00,sVar12);
      if (pvVar7->delta_page_length < local_a8) goto LAB_001d7ee6;
    }
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,sVar12);
    pvVar7->delta_nobjects = pvVar7->delta_nobjects - local_ac;
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,sVar12);
    pvVar7->delta_page_length = pvVar7->delta_page_length - local_a8;
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,sVar12);
    qVar10 = pvVar7->delta_page_length;
    pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (this_00,sVar12);
    pvVar7->delta_content_length = qVar10;
    uVar14 = 0;
    while( true ) {
      pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                         (&this_03->entries,sVar12);
      uVar11 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                         (&pvVar5->nshared_objects);
      if (uVar11 <= uVar14) break;
      pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (this_00,sVar12);
      pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                         (&this_03->entries,sVar12);
      __x = std::vector<int,_std::allocator<int>_>::at(&pvVar5->shared_identifiers,uVar14);
      std::vector<int,_std::allocator<int>_>::push_back(&pvVar7->shared_identifiers,__x);
      pvVar7 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (this_00,sVar12);
      local_50._M_dataplus._M_p._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&pvVar7->shared_numerators,(int *)&local_50);
      uVar14 = uVar14 + 1;
    }
    sVar12 = sVar12 + 1;
  } while( true );
}

Assistant:

void
QPDF::calculateHPageOffset(QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Page Offset Hint Table

    // We are purposely leaving some values set to their initial zero values.

    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    size_t npages = pages.size();
    CHPageOffset& cph = m->c_page_offset_data;
    std::vector<CHPageOffsetEntry>& cphe = cph.entries;

    // Calculate minimum and maximum values for number of objects per page and page length.

    int min_nobjects = cphe.at(0).nobjects;
    int max_nobjects = min_nobjects;
    int min_length = outputLengthNextN(pages.at(0).getObjectID(), min_nobjects, new_obj, obj);
    int max_length = min_length;
    int max_shared = cphe.at(0).nshared_objects;

    HPageOffset& ph = m->page_offset_hints;
    std::vector<HPageOffsetEntry>& phe = ph.entries;
    // npages is the size of the existing pages array.
    phe = std::vector<HPageOffsetEntry>(npages);

    for (unsigned int i = 0; i < npages; ++i) {
        // Calculate values for each page, assigning full values to the delta items.  They will be
        // adjusted later.

        // Repeat calculations for page 0 so we can assign to phe[i] without duplicating those
        // assignments.

        int nobjects = cphe.at(i).nobjects;
        int length = outputLengthNextN(pages.at(i).getObjectID(), nobjects, new_obj, obj);
        int nshared = cphe.at(i).nshared_objects;

        min_nobjects = std::min(min_nobjects, nobjects);
        max_nobjects = std::max(max_nobjects, nobjects);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        max_shared = std::max(max_shared, nshared);

        phe.at(i).delta_nobjects = nobjects;
        phe.at(i).delta_page_length = length;
        phe.at(i).nshared_objects = nshared;
    }

    ph.min_nobjects = min_nobjects;
    ph.first_page_offset = new_obj[obj[pages.at(0)].renumber].xref.getOffset();
    ph.nbits_delta_nobjects = nbits(max_nobjects - min_nobjects);
    ph.min_page_length = min_length;
    ph.nbits_delta_page_length = nbits(max_length - min_length);
    ph.nbits_nshared_objects = nbits(max_shared);
    ph.nbits_shared_identifier = nbits(m->c_shared_object_data.nshared_total);
    ph.shared_denominator = 4; // doesn't matter

    // It isn't clear how to compute content offset and content length.  Since we are not
    // interleaving page objects with the content stream, we'll use the same values for content
    // length as page length.  We will use 0 as content offset because this is what Adobe does
    // (implementation note 127) and pdlin as well.
    ph.nbits_delta_content_length = ph.nbits_delta_page_length;
    ph.min_content_length = ph.min_page_length;

    for (size_t i = 0; i < npages; ++i) {
        // Adjust delta entries
        if ((phe.at(i).delta_nobjects < min_nobjects) ||
            (phe.at(i).delta_page_length < min_length)) {
            stopOnError(
                "found too small delta nobjects or delta page length while writing "
                "linearization data");
        }
        phe.at(i).delta_nobjects -= min_nobjects;
        phe.at(i).delta_page_length -= min_length;
        phe.at(i).delta_content_length = phe.at(i).delta_page_length;

        for (size_t j = 0; j < toS(cphe.at(i).nshared_objects); ++j) {
            phe.at(i).shared_identifiers.push_back(cphe.at(i).shared_identifiers.at(j));
            phe.at(i).shared_numerators.push_back(0);
        }
    }
}